

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DestroyPlatformWindows(void)

{
  ImGuiContext *pIVar1;
  long lVar2;
  
  pIVar1 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    lVar2 = 0;
    do {
      DestroyPlatformWindow((pIVar1->Viewports).Data[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pIVar1->Viewports).Size);
  }
  return;
}

Assistant:

void ImGui::DestroyPlatformWindows()
{
    // We call the destroy window on every viewport (including the main viewport, index 0) to give a chance to the backend
    // to clear any data they may have stored in e.g. PlatformUserData, RendererUserData.
    // It is convenient for the platform backend code to store something in the main viewport, in order for e.g. the mouse handling
    // code to operator a consistent manner.
    // It is expected that the backend can handle calls to Renderer_DestroyWindow/Platform_DestroyWindow without
    // crashing if it doesn't have data stored.
    ImGuiContext& g = *GImGui;
    for (int i = 0; i < g.Viewports.Size; i++)
        DestroyPlatformWindow(g.Viewports[i]);
}